

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabImportErrmsg(Vdbe *p,sqlite3_vtab *pVtab)

{
  sqlite3 *db;
  char *pcVar1;
  
  pcVar1 = pVtab->zErrMsg;
  if (pcVar1 != (char *)0x0) {
    db = p->db;
    if (p->zErrMsg != (char *)0x0) {
      sqlite3DbFreeNN(db,p->zErrMsg);
      pcVar1 = pVtab->zErrMsg;
    }
    pcVar1 = sqlite3DbStrDup(db,pcVar1);
    p->zErrMsg = pcVar1;
    sqlite3_free(pVtab->zErrMsg);
    pVtab->zErrMsg = (char *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabImportErrmsg(Vdbe *p, sqlite3_vtab *pVtab){
  if( pVtab->zErrMsg ){
    sqlite3 *db = p->db;
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = sqlite3DbStrDup(db, pVtab->zErrMsg);
    sqlite3_free(pVtab->zErrMsg);
    pVtab->zErrMsg = 0;
  }
}